

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  long *plVar3;
  int *piVar4;
  Allocator *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i;
  uint uVar9;
  pointer ppLVar10;
  Layer *pLVar11;
  long lVar12;
  _func_int *p_Var13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  pointer __arg;
  _func_int **pp_Var17;
  void *pvVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ParamDict pd;
  int local_280;
  int local_27c;
  undefined1 local_278 [76];
  int local_22c;
  Mat local_228;
  _func_int **local_1e0;
  int *piStack_1d8;
  long local_1d0;
  int local_1c8;
  Allocator *local_1c0;
  uint local_1b8;
  int iStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  size_t local_1a0;
  _func_int **local_198;
  int *piStack_190;
  long local_188;
  int local_180;
  Allocator *local_178;
  uint local_170;
  int iStack_16c;
  uint uStack_168;
  int iStack_164;
  int local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  long lStack_140;
  undefined4 uStack_138;
  long *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined8 local_110;
  void *local_108;
  int *piStack_100;
  long lStack_f8;
  undefined4 uStack_f0;
  long *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  ParamDict local_a8;
  Mat local_98;
  size_t local_50;
  undefined1 *local_48;
  size_t local_40;
  Option *local_38;
  
  __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
  p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar16 = *(int *)(&this->field_0xd8 + (long)p_Var13) * *(int *)(&this->field_0xd4 + (long)p_Var13)
  ;
  iVar21 = *(int *)(&this->field_0xd0 + (long)p_Var13);
  iVar22 = *(int *)(&this->field_0x108 + (long)p_Var13);
  uVar15 = (long)*(int *)(&this->field_0x104 + (long)p_Var13) / (long)iVar22;
  uVar15 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) / (long)iVar16;
  ppLVar10 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_38 = opt;
  if (0 < (int)((ulong)((long)ppLVar10 - (long)__arg) >> 3)) {
    lVar19 = 0;
    do {
      if (__arg[lVar19] != (Layer *)0x0) {
        (*__arg[lVar19]->_vptr_Layer[1])();
        __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
        ppLVar10 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)((ulong)((long)ppLVar10 - (long)__arg) >> 3));
  }
  local_c0 = &this->group_ops;
  if (ppLVar10 != __arg) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = __arg;
  }
  iVar2 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) / iVar2;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c0,(long)iVar2);
  if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
    local_48 = &this->field_0x118;
    local_22c = iVar16 * i *
                (((int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                       (long)(iVar21 / iVar22)) * iVar22) / iVar2);
    local_40 = (size_t)local_22c;
    local_50 = (size_t)i;
    p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
    lVar19 = 0;
    do {
      local_228.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var13);
      local_228.data =
           (void *)(lVar19 * local_40 * local_228.elemsize +
                   *(long *)(&this->field_0x168 + (long)p_Var13));
      local_228.elempack = *(int *)(&this->field_0x180 + (long)p_Var13);
      local_228.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var13);
      local_228.refcount = (int *)0x0;
      local_228.dims = 1;
      local_228.w = (int)local_40;
      local_228.h = 1;
      local_228.d = 1;
      local_228.c = 1;
      local_228.cstep = local_40;
      Mat::clone(&local_98,(__fn *)&local_228,(void *)0x0,1,__arg);
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
      bVar20 = *(int *)(&this->field_0x100 + (long)p_Var13) == 0;
      if (bVar20) {
        pp_Var17 = (_func_int **)0x0;
        lVar14 = 0;
        local_27c = 0;
        local_b0 = (Allocator *)0x0;
        local_280 = 0;
        local_b8 = 0;
      }
      else {
        lVar14 = *(long *)(&this->field_0x1c0 + (long)p_Var13);
        pp_Var17 = (_func_int **)
                   (lVar19 * local_50 * lVar14 + *(long *)(&this->field_0x1b0 + (long)p_Var13));
        local_27c = *(int *)(&this->field_0x1c8 + (long)p_Var13);
        local_b0 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var13);
        local_b8 = local_50;
        local_280 = i;
      }
      uVar9 = (uint)!bVar20;
      pLVar11 = create_layer(6);
      ParamDict::ParamDict(&local_a8);
      ParamDict::set(&local_a8,0,i);
      ParamDict::set(&local_a8,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,4,0);
      ParamDict::set(&local_a8,0xe,0);
      ParamDict::set(&local_a8,5,
                     *(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,6,local_22c);
      ParamDict::set(&local_a8,8,
                     *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,9,
                     *(int *)(&this->field_0x110 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_a8,10,(Mat *)(local_48 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                    );
      (*pLVar11->_vptr_Layer[2])(pLVar11,&local_a8);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
        lVar14 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar14) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x10) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x18) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x1c) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x24) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x30) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x38) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x3c) = 0;
          *(undefined8 *)(local_278 + lVar14 + 0x44) = 0;
          lVar14 = lVar14 + 0x48;
        } while (lVar14 != 0x160);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_98.data;
        local_228.refcount = local_98.refcount;
        local_228.elemsize = local_98.elemsize;
        local_228.elempack = local_98.elempack;
        local_228.allocator = local_98.allocator;
        local_228.dims = local_98.dims;
        local_228.w = local_98.w;
        local_228.c = local_98.c;
        local_228.cstep = local_98.cstep;
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (*(int *)(&this->field_0x10c + (long)p_Var13) != 0) {
          local_278._64_8_ = 0;
          local_278._0_8_ = (_func_int **)0x0;
          local_278._8_4_ = 0;
          local_278._12_4_ = 0;
          local_278._16_4_ = 0;
          local_278._20_4_ = 0;
          local_278._24_4_ = 0;
          local_278._48_4_ = 0;
          local_278._52_4_ = 0;
          local_278._56_4_ = 0;
          local_278._32_8_ = (Allocator *)0x0;
          local_278._40_4_ = 0;
          local_278._44_4_ = 0;
          Mat::create((Mat *)local_278,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005131f0;
          auVar7 = _DAT_005131e0;
          auVar6 = _DAT_005130e0;
          uVar9 = local_278._56_4_ * local_278._64_4_;
          if (0 < (int)uVar9) {
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                     + lVar19 * 4);
            lVar14 = (ulong)uVar9 - 1;
            auVar26._8_4_ = (int)lVar14;
            auVar26._0_8_ = lVar14;
            auVar26._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar26 = auVar26 ^ _DAT_005130e0;
            uVar15 = 0;
            do {
              auVar24._8_4_ = (int)uVar15;
              auVar24._0_8_ = uVar15;
              auVar24._12_4_ = (int)(uVar15 >> 0x20);
              auVar25 = (auVar24 | auVar8) ^ auVar6;
              iVar21 = auVar26._0_4_;
              bVar20 = iVar21 < auVar25._0_4_;
              iVar22 = auVar26._4_4_;
              iVar16 = auVar25._4_4_;
              if ((bool)(~(iVar22 < iVar16 || iVar16 == iVar22 && bVar20) & 1)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4) = uVar1;
              }
              if (iVar22 >= iVar16 && (iVar16 != iVar22 || !bVar20)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 4) = uVar1;
              }
              auVar24 = (auVar24 | auVar7) ^ auVar6;
              iVar16 = auVar24._4_4_;
              if (iVar16 <= iVar22 && (iVar16 != iVar22 || auVar24._0_4_ <= iVar21)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 8) = uVar1;
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 0xc) = uVar1;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar9 + 3 & 0xfffffffc) != uVar15);
          }
          piVar4 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          if (piStack_1d8 != (int *)0x0) {
            LOCK();
            *piStack_1d8 = *piStack_1d8 + -1;
            UNLOCK();
            if (*piStack_1d8 == 0) {
              if (local_1c0 == (Allocator *)0x0) {
                if (local_1e0 != (_func_int **)0x0) {
                  free(local_1e0);
                }
              }
              else {
                (*local_1c0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1d8 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          local_1e0 = (_func_int **)local_278._0_8_;
          local_1d0 = CONCAT44(local_278._20_4_,local_278._16_4_);
          local_1c8 = local_278._24_4_;
          local_1c0 = (Allocator *)local_278._32_8_;
          local_1b8 = local_278._40_4_;
          iStack_1b4 = local_278._44_4_;
          uStack_1b0 = local_278._48_4_;
          uStack_1ac = local_278._52_4_;
          local_1a8 = local_278._56_4_;
          local_1a0 = local_278._64_8_;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar14 = *(long *)(&this->field_0x250 + (long)p_Var13);
          pp_Var17 = (_func_int **)(lVar14 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13))
          ;
          iVar21 = *(int *)(&this->field_0x258 + (long)p_Var13);
          pAVar5 = *(Allocator **)(&this->field_0x260 + (long)p_Var13);
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (_func_int **)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          piStack_190 = (int *)0x0;
          local_170 = 1;
          iStack_16c = 1;
          uStack_168 = 1;
          iStack_164 = 1;
          local_160 = 1;
          local_158 = 1;
          piVar4 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          local_198 = pp_Var17;
          local_188 = lVar14;
          local_180 = iVar21;
          local_178 = pAVar5;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
                if ((_func_int **)local_278._0_8_ != (_func_int **)0x0) {
                  free((void *)local_278._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_278._32_8_)[3])();
              }
            }
          }
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
          lVar14 = *(long *)(&this->field_0x298 + (long)p_Var13);
          lVar12 = *(long *)(&this->field_0x288 + (long)p_Var13);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var13);
          plVar3 = *(long **)(&this->field_0x2a8 + (long)p_Var13);
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (long *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (**(code **)(*local_130 + 0x18))();
              }
            }
          }
          piStack_148 = (int *)0x0;
          local_128 = 0x100000001;
          uStack_120 = 0x100000001;
          local_118 = 1;
          local_110 = 1;
          local_150 = (void *)(lVar14 * lVar19 + lVar12);
          lStack_140 = lVar14;
          uStack_138 = uVar1;
          local_130 = plVar3;
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_278,&local_228);
        (*pLVar11->_vptr_Layer[3])(pLVar11,(ModelBinFromMatArray *)local_278);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_278);
        lVar14 = 0xd8;
        do {
          piVar4 = *(int **)((long)&local_228.refcount + lVar14);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar18 = *(void **)((long)&local_228.data + lVar14);
              plVar3 = *(long **)((long)&local_228.allocator + lVar14);
              if (plVar3 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar14) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_228.elemsize + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_228.data + lVar14) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar14) = 0;
          *(undefined8 *)((long)&local_228.dims + lVar14) = 0;
          *(undefined8 *)((long)&local_228.h + lVar14) = 0;
          *(undefined4 *)((long)&local_228.c + lVar14) = 0;
          lVar14 = lVar14 + -0x48;
        } while (lVar14 != -0x48);
      }
      else {
        lVar12 = 0x40;
        do {
          *(undefined8 *)((long)&local_228.data + lVar12) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x10) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x18) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x1c) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x24) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x30) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x38) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x3c) = 0;
          *(undefined8 *)(local_278 + lVar12 + 0x44) = 0;
          lVar12 = lVar12 + 0x48;
        } while (lVar12 != 0x1a8);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        if (local_228.refcount != (int *)0x0) {
          LOCK();
          *local_228.refcount = *local_228.refcount + -1;
          UNLOCK();
          if (*local_228.refcount == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.data = local_98.data;
        local_228.refcount = local_98.refcount;
        local_228.elemsize = local_98.elemsize;
        local_228.elempack = local_98.elempack;
        local_228.allocator = local_98.allocator;
        local_228.dims = local_98.dims;
        local_228.w = local_98.w;
        local_228.c = local_98.c;
        local_228.cstep = local_98.cstep;
        if (piStack_1d8 != (int *)0x0) {
          LOCK();
          *piStack_1d8 = *piStack_1d8 + -1;
          UNLOCK();
          if (*piStack_1d8 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              if (local_1e0 != (_func_int **)0x0) {
                free(local_1e0);
              }
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1d8 = (int *)0x0;
        local_1c8 = local_27c;
        local_1c0 = local_b0;
        iStack_1b4 = local_280;
        local_1a0 = local_b8;
        p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
        local_1e0 = pp_Var17;
        local_1d0 = lVar14;
        local_1b8 = uVar9;
        uStack_1b0 = uVar9;
        uStack_1ac = uVar9;
        local_1a8 = uVar9;
        if (*(int *)(&this->field_0x10c + (long)p_Var13) != 0) {
          local_278._64_8_ = 0;
          local_278._0_8_ = (_func_int **)0x0;
          local_278._8_4_ = 0;
          local_278._12_4_ = 0;
          local_278._16_4_ = 0;
          local_278._20_4_ = 0;
          local_278._24_4_ = 0;
          local_278._48_4_ = 0;
          local_278._52_4_ = 0;
          local_278._56_4_ = 0;
          local_278._32_8_ = (Allocator *)0x0;
          local_278._40_4_ = 0;
          local_278._44_4_ = 0;
          Mat::create((Mat *)local_278,i,4,(Allocator *)0x0);
          auVar8 = _DAT_005131f0;
          auVar7 = _DAT_005131e0;
          auVar6 = _DAT_005130e0;
          uVar9 = local_278._56_4_ * local_278._64_4_;
          if (0 < (int)uVar9) {
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                     + lVar19 * 4);
            lVar14 = (ulong)uVar9 - 1;
            auVar25._8_4_ = (int)lVar14;
            auVar25._0_8_ = lVar14;
            auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
            uVar15 = 0;
            do {
              auVar23._8_4_ = (int)uVar15;
              auVar23._0_8_ = uVar15;
              auVar23._12_4_ = (int)(uVar15 >> 0x20);
              auVar26 = (auVar23 | auVar8) ^ auVar6;
              iVar21 = SUB164(auVar25 ^ auVar6,0);
              bVar20 = iVar21 < auVar26._0_4_;
              iVar22 = SUB164(auVar25 ^ auVar6,4);
              iVar16 = auVar26._4_4_;
              if ((bool)(~(iVar22 < iVar16 || iVar16 == iVar22 && bVar20) & 1)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4) = uVar1;
              }
              if (iVar22 >= iVar16 && (iVar16 != iVar22 || !bVar20)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 4) = uVar1;
              }
              auVar26 = (auVar23 | auVar7) ^ auVar6;
              iVar16 = auVar26._4_4_;
              if (iVar16 <= iVar22 && (iVar16 != iVar22 || auVar26._0_4_ <= iVar21)) {
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 8) = uVar1;
                *(undefined4 *)(local_278._0_8_ + uVar15 * 4 + 0xc) = uVar1;
              }
              uVar15 = uVar15 + 4;
            } while ((uVar9 + 3 & 0xfffffffc) != uVar15);
          }
          piVar4 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          if (piStack_190 != (int *)0x0) {
            LOCK();
            *piStack_190 = *piStack_190 + -1;
            UNLOCK();
            if (*piStack_190 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198 != (_func_int **)0x0) {
                  free(local_198);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          piStack_190 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          local_198 = (_func_int **)local_278._0_8_;
          local_188 = CONCAT44(local_278._20_4_,local_278._16_4_);
          local_180 = local_278._24_4_;
          local_178 = (Allocator *)local_278._32_8_;
          local_170 = local_278._40_4_;
          iStack_16c = local_278._44_4_;
          uStack_168 = local_278._48_4_;
          iStack_164 = local_278._52_4_;
          local_160 = local_278._56_4_;
          local_158 = local_278._64_8_;
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar14 = *(long *)(&this->field_0x250 + (long)p_Var13);
          pvVar18 = (void *)(lVar14 * lVar19 + *(long *)(&this->field_0x240 + (long)p_Var13));
          uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var13);
          plVar3 = *(long **)(&this->field_0x260 + (long)p_Var13);
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (long *)0x0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (**(code **)(*local_130 + 0x18))();
              }
            }
          }
          piStack_148 = (int *)0x0;
          local_128 = 0x100000001;
          uStack_120 = 0x100000001;
          local_118 = 1;
          local_110 = 1;
          piVar4 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
          local_150 = pvVar18;
          lStack_140 = lVar14;
          uStack_138 = uVar1;
          local_130 = plVar3;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
                if ((_func_int **)local_278._0_8_ != (_func_int **)0x0) {
                  free((void *)local_278._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_278._32_8_)[3])();
              }
            }
          }
          p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var13)) {
          lVar14 = *(long *)(&this->field_0x298 + (long)p_Var13);
          lVar12 = *(long *)(&this->field_0x288 + (long)p_Var13);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var13);
          plVar3 = *(long **)(&this->field_0x2a8 + (long)p_Var13);
          if (piStack_100 != (int *)0x0) {
            LOCK();
            *piStack_100 = *piStack_100 + -1;
            UNLOCK();
            if (*piStack_100 == 0) {
              if (local_e8 == (long *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (**(code **)(*local_e8 + 0x18))();
              }
            }
          }
          piStack_100 = (int *)0x0;
          local_e0 = 0x100000001;
          uStack_d8 = 0x100000001;
          local_d0 = 1;
          local_c8 = 1;
          local_108 = (void *)(lVar14 * lVar19 + lVar12);
          lStack_f8 = lVar14;
          uStack_f0 = uVar1;
          local_e8 = plVar3;
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_278,&local_228);
        (*pLVar11->_vptr_Layer[3])(pLVar11,(ModelBinFromMatArray *)local_278);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_278);
        lVar14 = 0x120;
        do {
          piVar4 = *(int **)((long)&local_228.refcount + lVar14);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar18 = *(void **)((long)&local_228.data + lVar14);
              plVar3 = *(long **)((long)&local_228.allocator + lVar14);
              if (plVar3 == (long *)0x0) {
                if (pvVar18 != (void *)0x0) {
                  free(pvVar18);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_228.cstep + lVar14) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_228.elemsize + lVar14 + 4) = 0;
          *(undefined8 *)((long)&local_228.data + lVar14) = 0;
          *(undefined8 *)((long)&local_228.refcount + lVar14) = 0;
          *(undefined8 *)((long)&local_228.dims + lVar14) = 0;
          *(undefined8 *)((long)&local_228.h + lVar14) = 0;
          *(undefined4 *)((long)&local_228.c + lVar14) = 0;
          lVar14 = lVar14 + -0x48;
        } while (lVar14 != -0x48);
      }
      (*pLVar11->_vptr_Layer[4])(pLVar11,local_38);
      (local_c0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar19] = pLVar11;
      ParamDict::~ParamDict(&local_a8);
      if (local_98.refcount != (int *)0x0) {
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar19 = lVar19 + 1;
      p_Var13 = this->_vptr_ConvolutionDepthWise_x86[-3];
    } while (lVar19 < *(int *)(&this->field_0x108 + (long)p_Var13));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}